

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::ProcessTryFinally
          (InterpreterStackFrame *this,byte *ip,JumpOffset jumpOffset,RegSlot regException,
          RegSlot regOffset,bool hasYield)

{
  short sVar1;
  code *pcVar2;
  JavascriptExceptionObject *pJVar3;
  bool bVar4;
  undefined4 *puVar5;
  ThreadContext *this_00;
  JavascriptExceptionObject *pJVar6;
  OpLayoutBrLong *pOVar7;
  bool endOfFinallyBlock;
  OpLayoutBrLong *playoutBrLong;
  uint uStack_60;
  OpCode finallyOp;
  LayoutSize layoutSize;
  int currOffset;
  int newOffset;
  JavascriptException *err;
  Var local_40;
  Var result;
  JavascriptExceptionObject *pJStack_30;
  bool skipFinallyBlock;
  JavascriptExceptionObject *pExceptionObject;
  RegSlot RStack_20;
  bool hasYield_local;
  RegSlot regOffset_local;
  RegSlot regException_local;
  JumpOffset jumpOffset_local;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  pJStack_30 = (JavascriptExceptionObject *)0x0;
  result._7_1_ = 0;
  local_40 = (Var)0x0;
  *(short *)(this + 0xdc) = *(short *)(this + 0xdc) + 1;
  pExceptionObject._3_1_ = hasYield;
  pExceptionObject._4_4_ = regOffset;
  RStack_20 = regException;
  regOffset_local._2_2_ = jumpOffset;
  _regException_local = ip;
  ip_local = (byte *)this;
  OrFlags(this,0x101);
  if (((byte)this[0xd6] >> 2 & 1) != 0) {
    CacheSp(this);
  }
  bVar4 = IsInDebugMode(this);
  if (bVar4) {
    bVar4 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction
                      (*(ScriptContext **)(this + 0x78));
    if (bVar4) {
      local_40 = ProcessWithDebugging_PreviousStmtTracking(this);
    }
    else {
      local_40 = ProcessWithDebugging(this);
    }
  }
  else {
    local_40 = Process(this);
  }
  if (local_40 == (Var)0x0) {
    if ((pExceptionObject._3_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1c23,"(hasYield)","hasYield");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    result._7_1_ = 1;
  }
  sVar1 = *(short *)(this + 0xdc);
  *(short *)(this + 0xdc) = sVar1 + -1;
  if ((short)(sVar1 + -1) == -1) {
    ClearFlags(this,0x101);
  }
  this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xfb | ((result._7_1_ ^ 0xff) & 1) << 2);
  if ((result._7_1_ & 1) == 0) {
    layoutSize = SmallLayout;
    uStack_60 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    if ((pExceptionObject._3_1_ & 1) != 0) {
      SetNonVarReg(this,RStack_20,pJStack_30);
      SetNonVarReg(this,pExceptionObject._4_4_,(Var)(long)(int)uStack_60);
    }
    if (pJStack_30 != (JavascriptExceptionObject *)0x0) {
      pJStack_30 = JavascriptExceptionObject::CloneIfStaticExceptionObject
                             (pJStack_30,*(ScriptContext **)(this + 0x78));
    }
    if ((pJStack_30 != (JavascriptExceptionObject *)0x0) &&
       (bVar4 = IsInDebugMode(this), pJVar3 = pJStack_30, bVar4)) {
      this_00 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
      pJVar6 = ThreadContext::GetPendingSOErrorObject(this_00);
      if (pJVar3 != pJVar6) {
        JavascriptExceptionObject::SetDebuggerSkip(pJStack_30,false);
      }
    }
    ByteCodeReader::SetCurrentRelativeOffset
              ((ByteCodeReader *)this,_regException_local,(int)regOffset_local._2_2_);
    RestoreSp(this);
    OrFlags(this,4);
    playoutBrLong._2_2_ =
         ByteCodeReader::ReadOp((ByteCodeReader *)this,(LayoutSize *)((long)&playoutBrLong + 4));
    if (playoutBrLong._2_2_ == BrLong) {
      if (playoutBrLong._4_4_ != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1c62,"(layoutSize == SmallLayout)",
                                    "layoutSize == SmallLayout");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pOVar7 = ByteCodeReader::BrLong((ByteCodeReader *)this);
      ByteCodeReader::SetCurrentRelativeOffset
                ((ByteCodeReader *)this,(byte *)(pOVar7 + 1),pOVar7->RelativeJumpOffset);
      playoutBrLong._2_2_ =
           ByteCodeReader::ReadOp((ByteCodeReader *)this,(LayoutSize *)((long)&playoutBrLong + 4));
    }
    if (playoutBrLong._2_2_ != Finally) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1c68,"(finallyOp == OpCode::Finally)",
                                  "Finally op not found at catch offset");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    layoutSize = ProcessFinally(this);
    sVar1 = *(short *)(this + 0xe4);
    *(short *)(this + 0xe4) = sVar1 + -1;
    if ((short)(sVar1 + -1) == -1) {
      ClearFlags(this,4);
    }
    if (layoutSize == SmallLayout) {
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,uStack_60);
      if (pJStack_30 != (JavascriptExceptionObject *)0x0) {
        JavascriptExceptionOperators::DoThrow(pJStack_30,*(ScriptContext **)(this + 0x78));
      }
    }
    else {
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,layoutSize);
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProcessTryFinally(const byte* ip, Js::JumpOffset jumpOffset, Js::RegSlot regException, Js::RegSlot regOffset, bool hasYield)
    {
        Js::JavascriptExceptionObject* pExceptionObject = nullptr;
        bool skipFinallyBlock = false;

        try
        {
            Js::Var result = nullptr;

            this->nestedTryDepth++;
            // mark the stackFrame as 'in try block'
            this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);

            if (shouldCacheSP)
            {
                CacheSp();
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            if (this->IsInDebugMode())
            {
#if ENABLE_TTD
                if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                {
                    result = this->ProcessWithDebugging_PreviousStmtTracking();
                }
                else
                {
                    result = this->ProcessWithDebugging();
                }
#else
                result = this->ProcessWithDebugging();
#endif
            }
            else
#endif
            {
                result = this->Process();
            }

            if (result == nullptr)
            {
                Assert(hasYield);
                skipFinallyBlock = true;
            }
        }
        catch (const Js::JavascriptException& err)
        {
            pExceptionObject = err.GetAndClear();
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        shouldCacheSP = !skipFinallyBlock;

        if (skipFinallyBlock)
        {
            // A leave occurred due to a yield
            return;
        }

        // Save the current IP so execution can continue there if the finally doesn't
        // take control of the flow.
        int newOffset = 0;
        int currOffset = m_reader.GetCurrentOffset();
        if (hasYield)
        {
            // save the exception if there is one to a register in case we yield during the finally block
            // and need to get that exception object back upon resume in OP_ResumeFinally
            SetNonVarReg(regException, pExceptionObject);
            SetNonVarReg(regOffset, reinterpret_cast<Js::Var>(currOffset));
        }

        if (pExceptionObject)
        {
            // Clone static exception object early in case finally block overwrites it
            pExceptionObject = pExceptionObject->CloneIfStaticExceptionObject(scriptContext);
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (pExceptionObject && this->IsInDebugMode() &&
            pExceptionObject != scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            // Swallowing an exception that has triggered a finally is not implemented
            // (This appears to be the same behavior as ie8)
            pExceptionObject->SetDebuggerSkip(false);
        }
#endif

        // Call into the finally by setting the IP, consuming the Finally, and letting the interpreter recurse.
        m_reader.SetCurrentRelativeOffset(ip, jumpOffset);

        RestoreSp();
        // mark the stackFrame as 'in finally block'
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        LayoutSize layoutSize;
        OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
        if (finallyOp == Js::OpCode::BrLong)
        {
            Assert(layoutSize == SmallLayout);
            auto playoutBrLong = m_reader.BrLong();
            m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
            finallyOp = m_reader.ReadOp(layoutSize);
        }
#endif
        AssertMsg(finallyOp == OpCode::Finally, "Finally op not found at catch offset");

        newOffset = this->ProcessFinally();

        if (--this->nestedFinallyDepth == -1)
        {
            // unmark the stackFrame as 'in finally block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
        }

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        if (pExceptionObject)
        {
            JavascriptExceptionOperators::DoThrow(pExceptionObject, scriptContext);
        }
    }